

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_tensor *
graph_copy_dup_tensor
          (ggml_hash_set hash_set,ggml_tensor **node_copies,ggml_context *ctx_allocated,
          ggml_context *ctx_unallocated,ggml_tensor *src)

{
  ggml_tensor *src_00;
  size_t sVar1;
  ggml_tensor *pgVar2;
  ggml_context *in_RCX;
  ggml_context *in_RDX;
  ggml_context *in_RSI;
  ggml_hash_set *in_RDI;
  ggml_hash_set in_stack_00000000;
  ggml_tensor *s;
  int i;
  ggml_tensor *dst;
  size_t id;
  ggml_tensor *in_stack_ffffffffffffff60;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *in_stack_ffffffffffffff70;
  ggml_context *ctx;
  int local_54;
  ggml_tensor *local_8;
  
  if (in_RCX == (ggml_context *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
               ,0x689,"GGML_ASSERT(%s) failed","src != NULL");
  }
  if (in_RCX[6].mem_buffer != (void *)0x0) {
    src_00 = (ggml_tensor *)
             ggml_hash_insert((ggml_hash_set *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (src_00 == (ggml_tensor *)0xfffffffffffffffe) {
      sVar1 = ggml_hash_find(in_RDI,in_stack_ffffffffffffff70);
      local_8 = (ggml_tensor *)(&in_RDI->size)[sVar1];
    }
    else {
      ctx = in_RDX;
      if ((in_RCX[6].mem_buffer != (void *)0x0) && (in_RCX[5].objects_end == (ggml_object *)0x0)) {
        ctx = in_RSI;
      }
      local_8 = ggml_dup_tensor_layout(ctx,in_stack_ffffffffffffff68);
      if (in_RCX[5].objects_end != (ggml_object *)0x0) {
        pgVar2 = graph_copy_dup_tensor
                           (in_stack_00000000,(ggml_tensor **)in_RSI,in_RDX,in_RCX,src_00);
        local_8->view_src = pgVar2;
        local_8->view_offs = in_RCX[6].mem_size;
      }
      local_8->op = (ggml_op)in_RCX[2].mem_size;
      memcpy(local_8->op_params,(void *)((long)&in_RCX[2].mem_size + 4),0x40);
      ggml_set_name(local_8,&in_RCX[6].mem_buffer_owned);
      for (local_54 = 0; local_54 < 10; local_54 = local_54 + 1) {
        if ((&in_RCX[3].objects_end)[local_54] != (ggml_object *)0x0) {
          pgVar2 = graph_copy_dup_tensor
                             (in_stack_00000000,(ggml_tensor **)in_RSI,in_RDX,in_RCX,src_00);
          local_8->src[local_54] = pgVar2;
        }
      }
      (&in_RDI->size)[(long)src_00] = (size_t)local_8;
    }
    return local_8;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x68a,"GGML_ASSERT(%s) failed","src->data && \"graph must be allocated\"");
}

Assistant:

static struct ggml_tensor * graph_copy_dup_tensor(struct ggml_hash_set hash_set, struct ggml_tensor ** node_copies,
    struct ggml_context * ctx_allocated, struct ggml_context * ctx_unallocated, struct ggml_tensor * src) {

    GGML_ASSERT(src != NULL);
    GGML_ASSERT(src->data && "graph must be allocated");

    size_t id = ggml_hash_insert(&hash_set, src);
    if (id == GGML_HASHSET_ALREADY_EXISTS) {
        return node_copies[ggml_hash_find(&hash_set, src)];
    }

    struct ggml_tensor * dst = ggml_dup_tensor_layout(src->data && !src->view_src ? ctx_allocated : ctx_unallocated, src);
    if (src->view_src != NULL) {
        dst->view_src = graph_copy_dup_tensor(hash_set, node_copies, ctx_allocated, ctx_unallocated, src->view_src);
        dst->view_offs = src->view_offs;
    }
    dst->op = src->op;
    memcpy(dst->op_params, src->op_params, sizeof(dst->op_params));
    ggml_set_name(dst, src->name);

    // copy src
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        struct ggml_tensor * s = src->src[i];
        if (s == NULL) {
            continue;
        }
        dst->src[i] = graph_copy_dup_tensor(hash_set, node_copies, ctx_allocated, ctx_unallocated, s);
    }

    node_copies[id] = dst;
    return dst;
}